

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O1

grid_iterator<unsigned_int> *
idx2::End<unsigned_int>(grid_iterator<unsigned_int> *__return_storage_ptr__,grid *Grid,volume *Vol)

{
  u64 uVar1;
  long lVar2;
  
  __return_storage_ptr__->Ptr = (uint *)0x0;
  uVar1 = (Grid->super_extent).From;
  lVar2 = (long)(Vol->Dims << 0x2b) >> 0x2b;
  __return_storage_ptr__->Ptr =
       (uint *)((Vol->Buffer).Data +
               ((long)(uVar1 << 0x2b) >> 0x29) +
               ((long)(uVar1 << 0x16) >> 0x2b) * lVar2 * 4 +
               ((long)(Vol->Dims << 0x16) >> 0x2b) * lVar2 *
               (long)((int)((long)(uVar1 * 2) >> 0x2b) +
                     (int)((long)(Grid->Strd * 2) >> 0x2b) *
                     (int)((long)((Grid->super_extent).Dims * 2) >> 0x2b)) * 4);
  return __return_storage_ptr__;
}

Assistant:

grid_iterator<t>
End(const grid& Grid, const volume& Vol)
{
  grid_iterator<t> Iter;
  v3i To3 = From(Grid) + v3i(0, 0, Dims(Grid).Z * Strd(Grid).Z);
  Iter.Ptr = (t*)const_cast<byte*>(Vol.Buffer.Data) + Row(Dims(Vol), To3);
  return Iter;
}